

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSAtom parse_ident(JSParseState *s,uint8_t **pp,BOOL *pident_has_escape,int c,BOOL is_private)

{
  uint8_t *puVar1;
  byte bVar2;
  JSRuntime *pJVar3;
  int iVar4;
  JSAtom JVar5;
  ulong len;
  uint8_t *p;
  char *str;
  uint8_t *p1;
  char *buf;
  JSParseState *local_d0;
  size_t ident_size;
  uint8_t **local_c0;
  char ident_buf [128];
  
  buf = ident_buf;
  ident_size = 0x80;
  if (is_private != 0) {
    ident_buf[0] = '#';
  }
  len = (ulong)(is_private != 0);
  p = *pp;
  local_d0 = s;
  local_c0 = pp;
  while( true ) {
    str = buf;
    if (c < 0x80) {
      buf[len] = (char)c;
      len = len + 1;
      p1 = p;
    }
    else {
      p1 = p;
      iVar4 = unicode_to_utf8((uint8_t *)(buf + len),c);
      len = len + (long)iVar4;
    }
    puVar1 = p1 + 1;
    bVar2 = *p1;
    c = (int)bVar2;
    p1 = puVar1;
    if (c == 0x5c) {
      c = 0x5c;
      if (*puVar1 == 'u') {
        c = lre_parse_escape(&p1,1);
        *pident_has_escape = 1;
      }
    }
    else if ((char)bVar2 < '\0') {
      c = unicode_from_utf8(p,6,&p1);
    }
    iVar4 = lre_js_is_ident_next(c);
    puVar1 = p1;
    if (iVar4 == 0) break;
    p = puVar1;
    if ((ident_size - 6 <= len) &&
       (iVar4 = ident_realloc(local_d0->ctx,&buf,&ident_size,ident_buf), iVar4 != 0)) {
      JVar5 = 0;
      str = buf;
LAB_00145dda:
      if (str != ident_buf) {
        pJVar3 = local_d0->ctx->rt;
        (*(pJVar3->mf).js_free)(&pJVar3->malloc_state,str);
      }
      *local_c0 = p;
      return JVar5;
    }
  }
  JVar5 = JS_NewAtomLen(local_d0->ctx,str,len);
  goto LAB_00145dda;
}

Assistant:

static JSAtom parse_ident(JSParseState *s, const uint8_t **pp,
                          BOOL *pident_has_escape, int c, BOOL is_private)
{
    const uint8_t *p, *p1;
    char ident_buf[128], *buf;
    size_t ident_size, ident_pos;
    JSAtom atom;
    
    p = *pp;
    buf = ident_buf;
    ident_size = sizeof(ident_buf);
    ident_pos = 0;
    if (is_private)
        buf[ident_pos++] = '#';
    for(;;) {
        p1 = p;
        
        if (c < 128) {
            buf[ident_pos++] = c;
        } else {
            ident_pos += unicode_to_utf8((uint8_t*)buf + ident_pos, c);
        }
        c = *p1++;
        if (c == '\\' && *p1 == 'u') {
            c = lre_parse_escape(&p1, TRUE);
            *pident_has_escape = TRUE;
        } else if (c >= 128) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p1);
        }
        if (!lre_js_is_ident_next(c))
            break;
        p = p1;
        if (unlikely(ident_pos >= ident_size - UTF8_CHAR_LEN_MAX)) {
            if (ident_realloc(s->ctx, &buf, &ident_size, ident_buf)) {
                atom = JS_ATOM_NULL;
                goto done;
            }
        }
    }
    atom = JS_NewAtomLen(s->ctx, buf, ident_pos);
 done:
    if (unlikely(buf != ident_buf))
        js_free(s->ctx, buf);
    *pp = p;
    return atom;
}